

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_insert.cpp
# Opt level: O3

void duckdb::PhysicalInsert::GetInsertInfo
               (BoundCreateTableInfo *info,vector<duckdb::LogicalType,_true> *insert_types)

{
  pointer pCVar1;
  pointer pCVar2;
  ColumnList *pCVar3;
  ColumnDefinition *this;
  idx_t iVar4;
  ColumnListIterator CVar5;
  ColumnLogicalIteratorInternal local_60;
  LogicalType local_40;
  
  pCVar2 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     (&info->base);
  CVar5 = ColumnList::Physical((ColumnList *)&pCVar2[1].catalog.field_2);
  pCVar3 = CVar5.list;
  local_60.physical = CVar5.physical;
  if (((undefined1  [16])CVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    pCVar1 = (pCVar3->columns).
             super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
             super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_60.end = ((long)pCVar1 -
                    (long)(pCVar3->columns).
                          super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          .
                          super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
    iVar4 = ((long)pCVar1 -
             (long)(pCVar3->columns).
                   super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   .
                   super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
  }
  else {
    iVar4 = (long)(pCVar3->physical_columns).
                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(pCVar3->physical_columns).
                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    local_60.end = iVar4;
  }
  local_60.pos = 0;
  local_60.list = pCVar3;
  while (((local_60.pos != iVar4 || (local_60.end != iVar4)) || (local_60.list != pCVar3))) {
    this = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*(&local_60);
    ColumnDefinition::GetType(&local_40,this);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
    emplace_back<duckdb::LogicalType>
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)insert_types,
               &local_40);
    LogicalType::~LogicalType(&local_40);
    local_60.pos = local_60.pos + 1;
  }
  return;
}

Assistant:

void PhysicalInsert::GetInsertInfo(const BoundCreateTableInfo &info, vector<LogicalType> &insert_types) {
	auto &create_info = info.base->Cast<CreateTableInfo>();
	for (auto &col : create_info.columns.Physical()) {
		insert_types.push_back(col.GetType());
	}
}